

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

LibraryIncludeStatementSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::LibraryIncludeStatementSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::parsing::Token&,slang::syntax::FilePathSpecSyntax&,slang::parsing::Token&>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1,FilePathSpecSyntax *args_2,Token *args_3)

{
  Info *pIVar1;
  size_t sVar2;
  pointer ppAVar3;
  Info *pIVar4;
  SyntaxNode *pSVar5;
  undefined4 uVar6;
  TokenKind TVar7;
  undefined1 uVar8;
  NumericTokenFlags NVar9;
  uint32_t uVar10;
  TokenKind TVar11;
  undefined1 uVar12;
  NumericTokenFlags NVar13;
  uint32_t uVar14;
  LibraryIncludeStatementSyntax *pLVar15;
  long lVar16;
  
  pLVar15 = (LibraryIncludeStatementSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8)
  ;
  if ((LibraryIncludeStatementSyntax *)this->endPtr < pLVar15 + 1) {
    pLVar15 = (LibraryIncludeStatementSyntax *)allocateSlow(this,0x78,8);
  }
  else {
    this->head->current = (byte *)(pLVar15 + 1);
  }
  TVar7 = args_1->kind;
  uVar8 = args_1->field_0x2;
  NVar9.raw = (args_1->numFlags).raw;
  uVar10 = args_1->rawLen;
  pIVar1 = args_1->info;
  TVar11 = args_3->kind;
  uVar12 = args_3->field_0x2;
  NVar13.raw = (args_3->numFlags).raw;
  uVar14 = args_3->rawLen;
  pIVar4 = args_3->info;
  (pLVar15->super_MemberSyntax).super_SyntaxNode.kind = LibraryIncludeStatement;
  (pLVar15->super_MemberSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pLVar15->super_MemberSyntax).super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  uVar6 = *(undefined4 *)&(args->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  pSVar5 = (args->super_SyntaxListBase).super_SyntaxNode.parent;
  (pLVar15->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind =
       (args->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)
   &(pLVar15->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar6
  ;
  (pLVar15->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent = pSVar5;
  (pLVar15->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->super_SyntaxListBase).super_SyntaxNode.previewNode;
  (pLVar15->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_005d2268;
  (pLVar15->super_MemberSyntax).attributes.super_SyntaxListBase.childCount =
       (args->super_SyntaxListBase).childCount;
  sVar2 = (args->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>).
          _M_extent._M_extent_value;
  (pLVar15->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
       (args->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>)._M_ptr;
  (pLVar15->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar2;
  (pLVar15->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_005d2768;
  (pLVar15->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent =
       (SyntaxNode *)pLVar15;
  sVar2 = (pLVar15->super_MemberSyntax).attributes.
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  if (sVar2 != 0) {
    ppAVar3 = (pLVar15->super_MemberSyntax).attributes.
              super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
    lVar16 = 0;
    do {
      *(LibraryIncludeStatementSyntax **)(*(long *)((long)ppAVar3 + lVar16) + 8) = pLVar15;
      lVar16 = lVar16 + 8;
    } while (sVar2 << 3 != lVar16);
  }
  (pLVar15->include).kind = TVar7;
  (pLVar15->include).field_0x2 = uVar8;
  (pLVar15->include).numFlags = (NumericTokenFlags)NVar9.raw;
  (pLVar15->include).rawLen = uVar10;
  (pLVar15->include).info = pIVar1;
  (pLVar15->filePath).ptr = args_2;
  (pLVar15->semi).kind = TVar11;
  (pLVar15->semi).field_0x2 = uVar12;
  (pLVar15->semi).numFlags = (NumericTokenFlags)NVar13.raw;
  (pLVar15->semi).rawLen = uVar14;
  (pLVar15->semi).info = pIVar4;
  (args_2->super_SyntaxNode).parent = (SyntaxNode *)pLVar15;
  return pLVar15;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }